

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive3_test.cc
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* re2::InterestingUTF8_abi_cxx11_(void)

{
  undefined8 in_RAX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  int i;
  int iVar2;
  int j;
  int j_1;
  int i_1;
  uint uVar3;
  bool bVar4;
  string asStackY_48 [12];
  Rune in_stack_ffffffffffffffc4;
  
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT71((int7)((ulong)in_RAX >> 8),InterestingUTF8[abi:cxx11]()::v_abi_cxx11_);
  if (InterestingUTF8[abi:cxx11]()::v_abi_cxx11_ == '\0') {
    pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__cxa_guard_acquire(&InterestingUTF8[abi:cxx11]()::v_abi_cxx11_);
    if ((int)pvVar1 != 0) {
      InterestingUTF8[abi:cxx11]()::v_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      InterestingUTF8[abi:cxx11]()::v_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      InterestingUTF8[abi:cxx11]()::v_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __cxa_atexit(std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~vector,&InterestingUTF8[abi:cxx11]()::v_abi_cxx11_,&__dso_handle);
      pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)__cxa_guard_release(&InterestingUTF8[abi:cxx11]()::v_abi_cxx11_);
    }
  }
  if (InterestingUTF8[abi:cxx11]()::init == '\0') {
    InterestingUTF8[abi:cxx11]()::init = '\x01';
    for (iVar2 = 1; iVar2 != 0x100; iVar2 = iVar2 + 1) {
      UTF8_abi_cxx11_(in_stack_ffffffffffffffc4);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &InterestingUTF8[abi:cxx11]()::v_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)asStackY_48);
      pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)std::__cxx11::string::~string(asStackY_48);
    }
    iVar2 = 8;
    while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
      UTF8_abi_cxx11_(in_stack_ffffffffffffffc4);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &InterestingUTF8[abi:cxx11]()::v_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)asStackY_48);
      pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)std::__cxx11::string::~string(asStackY_48);
    }
    for (uVar3 = 0x200; uVar3 < 0x10ffff; uVar3 = uVar3 * 2) {
      for (iVar2 = -8; iVar2 != 8; iVar2 = iVar2 + 1) {
        UTF8_abi_cxx11_(in_stack_ffffffffffffffc4);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &InterestingUTF8[abi:cxx11]()::v_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)asStackY_48)
        ;
        pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)std::__cxx11::string::~string(asStackY_48);
      }
    }
    iVar2 = 9;
    while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
      UTF8_abi_cxx11_(in_stack_ffffffffffffffc4);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &InterestingUTF8[abi:cxx11]()::v_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)asStackY_48);
      pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)std::__cxx11::string::~string(asStackY_48);
    }
  }
  return pvVar1;
}

Assistant:

static const vector<string>& InterestingUTF8() {
  static bool init;
  static vector<string> v;

  if (init)
    return v;

  init = true;
  // All the Latin1 equivalents are interesting.
  for (int i = 1; i < 256; i++)
    v.push_back(UTF8(i));

  // After that, the codes near bit boundaries are
  // interesting, because they span byte sequence lengths.
  for (int j = 0; j < 8; j++)
    v.push_back(UTF8(256 + j));
  for (int i = 512; i < Runemax; i <<= 1)
    for (int j = -8; j < 8; j++)
      v.push_back(UTF8(i + j));

  // The codes near Runemax, including Runemax itself, are interesting.
  for (int j = -8; j <= 0; j++)
    v.push_back(UTF8(Runemax + j));

  return v;
}